

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void enable_msi_interrupt(ixgbe_device *dev,uint16_t queue_id)

{
  int reg;
  uint32_t uVar1;
  ushort in_SI;
  long in_RDI;
  u32 mask;
  int8_t in_stack_ffffffffffffffdd;
  int8_t in_stack_ffffffffffffffde;
  int8_t in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  set_ivar((ixgbe_device *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdf,in_stack_ffffffffffffffde,in_stack_ffffffffffffffdd);
  set_reg32(*(uint8_t **)(in_RDI + 0x70),0x810,0);
  if (in_SI < 0x18) {
    reg = (uint)in_SI * 4 + 0x820;
  }
  else {
    reg = (in_SI - 0x18) * 4 + 0x12300;
  }
  set_reg32(*(uint8_t **)(in_RDI + 0x70),reg,*(uint32_t *)(in_RDI + 0x5c));
  clear_interrupts((ixgbe_device *)0x106cfb);
  uVar1 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x880);
  set_reg32(*(uint8_t **)(in_RDI + 0x70),0x880,1 << ((byte)in_SI & 0x1f) | uVar1);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Using MSI interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",0x96
          ,"enable_msi_interrupt");
  return;
}

Assistant:

static void enable_msi_interrupt(struct ixgbe_device* dev, uint16_t queue_id) {
	// Step 1: The software driver associates between Tx and Rx interrupt causes and the EICR
	// register by setting the IVAR[n] registers.
	set_ivar(dev, 0, queue_id, 0);

	// Step 2: Program SRRCTL[n].RDMTS (per receive queue) if software uses the receive
	// descriptor minimum threshold interrupt
	// We don't use the minimum threshold interrupt

	// Step 3: All interrupts should be set to 0b (no auto clear in the EIAC register). Following an
	// interrupt, software might read the EICR register to check for the interrupt causes.
	set_reg32(dev->addr, IXGBE_EIAC, 0x00000000);

	// Step 4: Set the auto mask in the EIAM register according to the preferred mode of operation.
	// In our case we prefer not auto-masking the interrupts

	// Step 5: Set the interrupt throttling in EITR[n] and GPIE according to the preferred mode of operation.
	set_reg32(dev->addr, IXGBE_EITR(queue_id), dev->ixy.interrupts.itr_rate);

	// Step 6: Software clears EICR by writing all ones to clear old interrupt causes
	clear_interrupts(dev);

	// Step 7: Software enables the required interrupt causes by setting the EIMS register
	u32 mask = get_reg32(dev->addr, IXGBE_EIMS);
	mask |= (1 << queue_id);
	set_reg32(dev->addr, IXGBE_EIMS, mask);
	debug("Using MSI interrupts");
}